

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorGradient.cpp
# Opt level: O1

void __thiscall
Rml::DecoratorStraightGradient::RenderElement
          (DecoratorStraightGradient *this,Element *element,DecoratorDataHandle element_data)

{
  Vector2f translation;
  CompiledShader local_18;
  
  translation = Element::GetAbsoluteOffset(element,Border);
  local_18.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.render_manager =
       (RenderManager *)0x0;
  local_18.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.resource_handle = 0;
  Geometry::Render((Geometry *)element_data,translation,
                   (Texture)(ZEXT816(0xffffffffffffffff) << 0x40),&local_18);
  CompiledShader::Release(&local_18);
  return;
}

Assistant:

void DecoratorStraightGradient::RenderElement(Element* element, DecoratorDataHandle element_data) const
{
	auto* data = reinterpret_cast<Geometry*>(element_data);
	data->Render(element->GetAbsoluteOffset(BoxArea::Border));
}